

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.c
# Opt level: O2

int readline(char *pl)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  ushort **ppuVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  char *pl_00;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar8;
  
  uVar3 = (ulong)(uint)c;
  uVar8 = uVar3;
  if (c == -1) {
    return 0;
  }
  do {
    if ((int)uVar3 == -1) {
LAB_00105de9:
      *pl = '\0';
      ppuVar4 = __ctype_b_loc();
      pl_00 = &DAT_0010c80d;
      do {
        pcVar1 = pl_00 + 3;
        pl_00 = pl_00 + 1;
      } while ((*(byte *)((long)*ppuVar4 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
      if (*pcVar1 == '\0') {
        linebuf[0] = '\n';
        linebuf[1] = '\0';
      }
      else {
        do {
          pcVar1 = pl_00 + 2;
          pl_00 = pl_00 + 1;
        } while (*pcVar1 != '\0');
        while( true ) {
          if ((*(byte *)((long)*ppuVar4 + (long)*pl_00 * 2 + 1) & 0x20) == 0) break;
          pl_00 = pl_00 + -1;
          column = column + -1;
        }
        if (*pl_00 == '\\') {
          line = line + 1;
          readline(pl_00);
          update_line = 1;
        }
        else {
          column = column + -1;
          pl_00[1] = '\n';
          pl_00[2] = '\0';
        }
      }
      return 1;
    }
    readbyte();
    if (c == -1) {
      iVar6 = column;
      if (mlc == 1) {
        err(E,"unterminated comment");
        iVar6 = column;
      }
    }
    else {
      if (c != 9) {
        if (c == 10) {
          if (l == 0xd) {
LAB_00105dde:
            readbyte();
          }
        }
        else {
          if (c != 0xd) {
            bVar7 = c == 0x2f & (mlc ^ 1);
            if ((l == 0x2f & bVar7) == 1) {
              uVar2 = 0x2f;
              while ((0xd < uVar2 || (iVar6 = column, (0x2c00U >> (uVar2 & 0x1f) & 1) == 0))) {
                readbyte();
                uVar2 = l;
              }
            }
            else if ((bVar7 & l == 0x2a) == 1) {
              readbyte();
              pl[0] = ' ';
              pl[1] = ' ';
              pl = pl + 2;
              mlc = 1;
              iVar6 = column;
            }
            else if ((c == 0x2a & mlc & l == 0x2f) == 1) {
              readbyte();
              pl[0] = ' ';
              pl[1] = ' ';
              pl = pl + 2;
              mlc = 0;
              eline = line;
              ecolumn = column;
              iVar6 = column;
            }
            else {
              iVar6 = column + 1;
              column = iVar6;
              if ((mlc & 1) == 0) {
                *pl = (char)c;
              }
              else {
                *pl = ' ';
              }
              pl = pl + 1;
            }
            goto LAB_00105d35;
          }
          if (l == 10) goto LAB_00105dde;
        }
        *pl = '\n';
        pl = pl + 1;
        goto LAB_00105de9;
      }
      iVar5 = column % tabstop;
      column = (tabstop - iVar5) + column;
      for (iVar5 = iVar5 - tabstop; iVar6 = column, iVar5 != 0; iVar5 = iVar5 + 1) {
        *pl = ' ';
        pl = pl + 1;
      }
    }
LAB_00105d35:
    if (0xfff < iVar6) {
      ccerr(F,"line too long in file \"%s\" at line %d",filnam,(ulong)(uint)line,in_R8,in_R9,uVar8);
    }
    uVar3 = (ulong)(uint)c;
  } while( true );
}

Assistant:

int readline(char* pl)
{
    if (c == EOF)
        return 0;

    while (c != EOF)
    {
        readbyte();

        if (c == EOF)
        {
            if (mlc)
                err(E, "unterminated comment");

        }
        else if (c == '\n')
        {
            if (l == '\r')
                readbyte();

            *pl++ = '\n';
            break;
        }
        else if (c == '\r')
        {
            if (l == '\n')
                readbyte();

            *pl++ = '\n';
            break;
        }
        else if (c == '\t')
        {
            int sp = tabstop - (column % tabstop);
            column += sp;
            while (sp--)
                *pl++ = ' ';
        }
        /*else if (c == '\v')
        {

        } */
        else if (!mlc && c == '/' && l == '/')
        {
            while (l != '\n' && l != '\r' && l != '\v')
                readbyte();
        }
        else if (!mlc && c == '/' && l == '*')
        {
            readbyte();
            *pl++ = ' ';
            *pl++ = ' ';
            mlc = 1;
        }
        else if (mlc && c == '*' && l == '/')
        {
            readbyte();
            *pl++ = ' ';
            *pl++ = ' ';
            mlc = 0;

            eline = line;
            ecolumn = column;
        }
        else
        {
            ++column;
            if (mlc)
                *pl++ = ' ';
            else
                *pl++ = c;
        }

        if (column >= BUFSIZE)
            ccerr(F, "line too long in file \"%s\" at line %d", filnam, line);
    }
    *pl = 0;
    
    pl = linebuf;
    while (isspace(*pl))
        pl++;
    
    /* empty line ? */
    if (!*pl)
    {
        linebuf[0] = '\n';
        linebuf[1] = 0;
        return 1;
    }
    
    /* search for the last non white character of the line */
    while (*pl)
        ++pl;
    --pl;
    
    while (isspace(*pl))
    {
        --pl;
        --column;
    }
    
    /* merge lines or remove trailing spaces */
    if (*pl == '\\')
    {
        ++line;
        readline(pl);
        update_line = 1;
    }
    else
    {
        --column;
        *++pl = '\n';
        *++pl = 0;
    }
    
    return 1;
}